

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O2

int SendBreakPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,int mode,int breakduration)

{
  int iVar1;
  char *__s;
  long Milliseconds;
  
  switch(mode) {
  case 1:
    if ((pPathfinderDVL->RS232Port).DevType == 0) {
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if (iVar1 != 0) goto LAB_0017bf02;
      mSleep((long)breakduration);
    }
switchD_0017bcf3_caseD_3:
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",4);
    if (iVar1 == 0) {
      if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0)
         ) {
        fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
        fflush((FILE *)pPathfinderDVL->pfSaveFile);
      }
LAB_0017bebc:
      Milliseconds = (long)breakduration;
LAB_0017bebf:
      mSleep(Milliseconds);
      iVar1 = 0;
    }
    else {
LAB_0017bf02:
      __s = "Error writing data to a PathfinderDVL. ";
LAB_0017bf09:
      puts(__s);
      iVar1 = 1;
    }
    return iVar1;
  case 2:
    if ((pPathfinderDVL->RS232Port).DevType != 0) {
LAB_0017bdd0:
      __s = "Cannot send a Hard Break to a PathfinderDVL through Ethernet. ";
      goto LAB_0017bf09;
    }
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) goto LAB_0017bf02;
    goto LAB_0017bebc;
  case 3:
    goto switchD_0017bcf3_caseD_3;
  case 4:
    if ((pPathfinderDVL->RS232Port).DevType != 0) goto LAB_0017bdd0;
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if ((iVar1 != 0) ||
       (iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration),
       iVar1 != 0)) goto LAB_0017bf02;
    mSleep((long)(breakduration / 2));
    iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
    if (iVar1 != 0) goto LAB_0017bf02;
    Milliseconds = (long)(int)((double)breakduration * 3.5);
    goto LAB_0017bebf;
  case 5:
    goto switchD_0017bcf3_caseD_5;
  default:
    if ((pPathfinderDVL->RS232Port).DevType == 0) {
      iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
      if ((iVar1 == 0) &&
         (iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration),
         iVar1 == 0)) {
        mSleep((long)(breakduration / 2));
        iVar1 = SendBreakComputerRS232Port((pPathfinderDVL->RS232Port).hDev,breakduration);
        if (iVar1 == 0) {
          mSleep((long)(int)((double)breakduration * 3.5));
          goto switchD_0017bcf3_caseD_5;
        }
      }
      goto LAB_0017bf02;
    }
switchD_0017bcf3_caseD_5:
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",4);
    if (iVar1 != 0) goto LAB_0017bf02;
    if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0))
    {
      fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    Milliseconds = (long)breakduration;
    mSleep(Milliseconds);
    iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"===\r",4);
    if (iVar1 != 0) goto LAB_0017bf02;
    if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0))
    {
      fwrite("===\r",4,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    goto LAB_0017bebf;
  }
}

Assistant:

inline int SendBreakPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, int mode, int breakduration)
{
	char* softbreakbuf = "===\r";

	switch(mode)
	{
	case HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration);
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_BREAK_MODE_PATHFINDERDVL:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
			return EXIT_FAILURE;
		}
		break;
	case DOUBLE_SOFT_BREAK_MODE_PATHFINDERDVL:
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	case DOUBLE_HARD_SOFT_BREAK_MODE_PATHFINDERDVL:
	default:
		if (pPathfinderDVL->RS232Port.DevType == LOCAL_TYPE_RS232PORT)
		{
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep(breakduration/2);
			if (SendBreakComputerRS232Port(pPathfinderDVL->RS232Port.hDev, breakduration) != EXIT_SUCCESS)
			{
				printf("Error writing data to a PathfinderDVL. \n");
				return EXIT_FAILURE;
			}
			mSleep((int)(3.5*breakduration));
		}
		else
		{
			//printf("Cannot send a Hard Break to a PathfinderDVL through Ethernet. \n");
		}
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)softbreakbuf, (int)strlen(softbreakbuf)) != EXIT_SUCCESS)
		{
			printf("Error writing data to a PathfinderDVL. \n");
			return EXIT_FAILURE;
		}
		if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
		{
			fwrite(softbreakbuf, strlen(softbreakbuf), 1, pPathfinderDVL->pfSaveFile);
			fflush(pPathfinderDVL->pfSaveFile);
		}
		mSleep(breakduration);
		break;
	}

	return EXIT_SUCCESS;
}